

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# real.c
# Opt level: O1

void fft_c2r_exec(fft_real_object obj,fft_data *inp,double *oup)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  int iVar7;
  fft_object obj_00;
  fft_data *inp_00;
  fft_data *oup_00;
  long lVar8;
  size_t sVar9;
  size_t __size;
  double dVar10;
  double dVar11;
  
  obj_00 = obj->cobj;
  iVar7 = obj_00->N;
  __size = (long)iVar7 << 4;
  inp_00 = (fft_data *)malloc(__size);
  oup_00 = (fft_data *)malloc(__size);
  if (0 < (long)iVar7) {
    lVar8 = 0;
    sVar9 = __size;
    do {
      dVar1 = *(double *)((long)&inp->re + lVar8);
      dVar2 = *(double *)((long)&inp->im + lVar8);
      dVar3 = *(double *)((long)&inp->re + sVar9);
      dVar4 = *(double *)((long)&inp->im + sVar9);
      dVar10 = -dVar2 - dVar4;
      dVar11 = dVar1 - dVar3;
      dVar5 = *(double *)((long)&obj->twiddle2[0].re + lVar8);
      dVar6 = *(double *)((long)&obj->twiddle2[0].im + lVar8);
      *(double *)((long)&inp_00->re + lVar8) = (dVar10 * dVar5 + dVar3 + dVar1) - dVar11 * dVar6;
      *(double *)((long)&inp_00->im + lVar8) = dVar10 * dVar6 + dVar11 * dVar5 + (dVar2 - dVar4);
      lVar8 = lVar8 + 0x10;
      sVar9 = sVar9 - 0x10;
    } while (sVar9 != 0);
  }
  fft_exec(obj_00,inp_00,oup_00);
  if (0 < iVar7) {
    sVar9 = 0;
    do {
      *(undefined8 *)((long)oup + sVar9) = *(undefined8 *)((long)&oup_00->re + sVar9);
      *(undefined8 *)((long)oup + sVar9 + 8) = *(undefined8 *)((long)&oup_00->im + sVar9);
      sVar9 = sVar9 + 0x10;
    } while (__size != sVar9);
  }
  free(inp_00);
  free(oup_00);
  return;
}

Assistant:

void fft_c2r_exec(fft_real_object obj,fft_data *inp,fft_type *oup) {
	
	fft_data* cinp;
	fft_data* coup;
	int i,N2,N;
	fft_type temp1,temp2;
	N2 = obj->cobj->N;
	N = N2*2;
	
	cinp = (fft_data*) malloc (sizeof(fft_data) * N2);
	coup = (fft_data*) malloc (sizeof(fft_data) * N2);
	
	for (i = 0; i < N2; ++i) {
		temp1 = -inp[i].im - inp[N2-i].im ;
		temp2 = -inp[N2-i].re + inp[i].re ;
		cinp[i].re = inp[i].re + inp[N2-i].re + (temp1 * obj->twiddle2[i].re) - (temp2 * obj->twiddle2[i].im);
		cinp[i].im = inp[i].im - inp[N2-i].im + (temp2 * obj->twiddle2[i].re) + (temp1 * obj->twiddle2[i].im);
	}
	
	fft_exec(obj->cobj,cinp,coup);
	for (i = 0; i < N2; ++i) {
		oup[2*i] = coup[i].re;
		oup[2*i+1] = coup[i].im;
	}
	free(cinp);
	free(coup);


}